

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory_Banks.c
# Opt level: O2

uint8_t gb_read_none(MemoryBankController *mc,uint16_t address)

{
  uint8_t uVar1;
  
  if (-1 < (short)address) {
    return mc->rom[address];
  }
  if ((address & 0xe000) == 0xa000) {
    return 0xff;
  }
  uVar1 = gb_common_reads(mc,address);
  return uVar1;
}

Assistant:

uint8_t gb_read_none(MemoryBankController* mc, uint16_t address) {

    if(address <= 0x7FFF) {
        return mc->rom[address];
    }

    //No licensed games use rom+ram, so we just return 0xFF     
    if (address >= 0xA000 && address <= 0xBFFF) {
        return 0xFF;
    }

    return gb_common_reads(mc, address);
}